

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_INT local_cc;
  REF_STATUS local_c8;
  REF_INT local_c4;
  REF_STATUS local_c0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT global;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_INT *max_faceid_local;
  REF_INT *min_faceid_local;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  unique0x00012000 = ref_grid->cell[3];
  for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&ref_private_macro_code_rss);
    if (RVar1 == 0) {
      if (*min_faceid < (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per]) {
        local_c0 = *min_faceid;
      }
      else {
        local_c0 = (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per];
      }
      *min_faceid = local_c0;
      if ((&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per] < *max_faceid) {
        local_c4 = *max_faceid;
      }
      else {
        local_c4 = (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per];
      }
      *max_faceid = local_c4;
    }
  }
  unique0x00012000 = ref_grid->cell[6];
  for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar1 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&ref_private_macro_code_rss);
    if (RVar1 == 0) {
      if (*min_faceid < (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per]) {
        local_c8 = *min_faceid;
      }
      else {
        local_c8 = (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per];
      }
      *min_faceid = local_c8;
      if ((&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per] < *max_faceid) {
        local_cc = *max_faceid;
      }
      else {
        local_cc = (&ref_private_macro_code_rss)[stack0xffffffffffffffc8->node_per];
      }
      *max_faceid = local_cc;
    }
  }
  if (1 < ref_mpi_00->n) {
    uVar2 = ref_mpi_min(ref_mpi_00,min_faceid,&ref_private_macro_code_rss_1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x173,
             "ref_grid_faceid_range",(ulong)uVar2,"mpi min face");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi_00,&ref_private_macro_code_rss_1,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x174,
             "ref_grid_faceid_range",(ulong)uVar2,"mpi min face");
      return uVar2;
    }
    *min_faceid = ref_private_macro_code_rss_1;
    uVar2 = ref_mpi_max(ref_mpi_00,max_faceid,&ref_private_macro_code_rss_1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x178,
             "ref_grid_faceid_range",(ulong)uVar2,"mpi max face");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi_00,&ref_private_macro_code_rss_1,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x179,
             "ref_grid_faceid_range",(ulong)uVar2,"mpi max face");
      return uVar2;
    }
    *max_faceid = ref_private_macro_code_rss_1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid, REF_INT *min_faceid,
                                         REF_INT *max_faceid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_node_per(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_node_per(ref_cell)]);
  }